

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx_string.hpp
# Opt level: O0

cx_string<9UL> mserialize::cx_strcat<4ul,5ul>(cx_string<4UL> *strings,cx_string<5UL> *strings_1)

{
  cx_string<5UL> *in_RSI;
  cx_string<4UL> *in_RDI;
  cx_string<9UL> cVar1;
  size_t s;
  size_t i;
  char *out;
  size_t size [3];
  char *data [3];
  char buffer [10];
  ulong local_80;
  ulong local_78;
  char *local_70;
  ulong local_68;
  size_t local_60;
  size_t local_58;
  char *local_48;
  data_ref local_40;
  data_ref local_38;
  char local_2a [10];
  cx_string<5UL> *local_20;
  cx_string<4UL> *local_18;
  cx_string<9UL> local_a;
  unkbyte9 Var2;
  
  local_20 = in_RSI;
  local_18 = in_RDI;
  memset(local_2a,0,10);
  local_48 = "";
  local_40 = cx_string<4UL>::data(local_18);
  local_38 = cx_string<5UL>::data(local_20);
  local_68 = 0;
  local_60 = cx_string<4UL>::size(local_18);
  local_58 = cx_string<5UL>::size(local_20);
  local_70 = local_2a;
  for (local_78 = 1; local_78 < 3; local_78 = local_78 + 1) {
    for (local_80 = 0; local_80 < (&local_68)[local_78]; local_80 = local_80 + 1) {
      *local_70 = (&local_48)[local_78][local_80];
      local_70 = local_70 + 1;
    }
  }
  cx_string<9UL>::cx_string(&local_a,local_2a);
  cVar1._data[0] = local_a._data[0];
  Var2._1_1_ = local_a._data[1];
  Var2._2_1_ = local_a._data[2];
  Var2._3_1_ = local_a._data[3];
  Var2._4_1_ = local_a._data[4];
  Var2._5_1_ = local_a._data[5];
  Var2._6_1_ = local_a._data[6];
  Var2._7_1_ = local_a._data[7];
  cVar1._data[8] = local_a._data[8];
  cVar1._data[9] = local_a._data[9];
  return (cx_string<9UL>)cVar1._data;
}

Assistant:

constexpr auto cx_strcat(const cx_string<N>&&... strings)
{
  char buffer[detail::sum<N...>()+1] = {0};
  const char* data[] = {"", strings.data()...};
  const std::size_t size[] = {0, strings.size()...};

  char* out = buffer;
  for (std::size_t i = 1; i <= sizeof...(N); ++i)
  {
    for (std::size_t s = 0; s < size[i]; ++s) { *out++ = data[i][s]; } // NOLINT
  }

  return cx_string<sizeof(buffer)-1>(buffer);
}